

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::bson::
basic_bson_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
::read_cstring(basic_bson_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
               *this,string_type *buffer,error_code *ec)

{
  type_conflict2 tVar1;
  reference pvVar2;
  value_type *in_RDX;
  binary_iterator_source<(anonymous_namespace)::MyIterator> *in_RSI;
  vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_> *in_RDI;
  size_t n;
  uint8_t c;
  type_conflict2 tVar3;
  undefined7 in_stack_ffffffffffffffe0;
  char cVar4;
  
  cVar4 = -1;
  while( true ) {
    tVar1 = binary_iterator_source<(anonymous_namespace)::MyIterator>::read<std::input_iterator_tag>
                      (in_RSI,in_RDX,CONCAT17(cVar4,in_stack_ffffffffffffffe0));
    tVar3 = tVar1;
    pvVar2 = std::vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
             ::back(in_RDI);
    pvVar2->pos = tVar1 + pvVar2->pos;
    if (tVar3 != 1) {
      std::error_code::operator=
                ((error_code *)CONCAT17(cVar4,in_stack_ffffffffffffffe0),(bson_errc)(tVar3 >> 0x20))
      ;
      *(undefined1 *)
       &(in_RDI->
        super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
        )._M_impl.super__Vector_impl_data._M_finish = 0;
      return;
    }
    if (cVar4 == '\0') break;
    std::__cxx11::string::push_back((char)in_RSI);
  }
  return;
}

Assistant:

void read_cstring(string_type& buffer, std::error_code& ec)
    {
        uint8_t c = 0xff;
        while (true)
        {
            std::size_t n = source_.read(&c, 1);
            state_stack_.back().pos += n;
            if (JSONCONS_UNLIKELY(n != 1))
            {
                ec = bson_errc::unexpected_eof;
                more_ = false;
                return;
            }
            if (c == 0)
            {
                break;
            }
            buffer.push_back(c);
        }
    }